

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O1

value * __thiscall mpt::source<double>::value(source<double> *this)

{
  uint uVar1;
  long lVar2;
  double *pdVar3;
  
  lVar2 = this->_pos;
  if (((-1 < lVar2) &&
      (pdVar3 = (this->super_span<const_double>)._base,
      pdVar3 != (double *)0x0 && lVar2 < (long)((this->super_span<const_double>)._len >> 3))) &&
     (uVar1 = this->_type, uVar1 - 1 < 0xfff)) {
    (this->_val)._addr = pdVar3 + lVar2;
    (this->_val)._type = (ulong)uVar1;
    return &this->_val;
  }
  return (value *)0x0;
}

Assistant:

const struct value *value() __MPT_OVERRIDE
	{
		const T *val;
		if (_pos < 0 || !(val = span<const T>::nth(_pos))) {
			return 0;
		}
		return _val.set(_type, val) ? &_val : 0;
	}